

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer_device.cpp
# Opt level: O2

RTCScene embree::convertScene(ISPCScene *scene_in)

{
  ISPCGeometry **ppIVar1;
  RTCScene pRVar2;
  uint i;
  ulong uVar3;
  RTCFeatureFlags feature_mask;
  
  uVar3 = 0;
  do {
    if (scene_in->numGeometries == uVar3) goto LAB_0011e5b6;
    ppIVar1 = scene_in->geometries + uVar3;
    uVar3 = uVar3 + 1;
  } while ((*ppIVar1)->type != SUBDIV_MESH);
  data[0x20] = 1;
LAB_0011e5b6:
  feature_mask = RTC_FEATURE_FLAG_NONE;
  pRVar2 = ConvertScene(g_device,g_ispc_scene,RTC_BUILD_QUALITY_MEDIUM,RTC_SCENE_FLAG_NONE,
                        &feature_mask);
  if (g_use_scene_features == true) {
    g_feature_mask = feature_mask;
  }
  rtcSetSceneProgressMonitorFunction(pRVar2,monitorProgressFunction,0);
  return pRVar2;
}

Assistant:

RTCScene convertScene(ISPCScene* scene_in)
{
  for (unsigned int i=0; i<scene_in->numGeometries; i++)
  {
    ISPCGeometry* geometry = scene_in->geometries[i];
    if (geometry->type == SUBDIV_MESH) {
      data.subdiv_mode = true; break;
    }
  }

  RTCFeatureFlags feature_mask = RTC_FEATURE_FLAG_NONE;
  RTCScene scene_out = ConvertScene(g_device, g_ispc_scene, RTC_BUILD_QUALITY_MEDIUM, RTC_SCENE_FLAG_NONE, &feature_mask);
  if (g_use_scene_features) g_feature_mask = feature_mask;
  rtcSetSceneProgressMonitorFunction(scene_out,monitorProgressFunction,nullptr);

  /* commit changes to scene */
  return scene_out;
}